

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi.c
# Opt level: O3

OPJ_BOOL opj_pi_next(opj_pi_iterator_t *pi)

{
  int iVar1;
  OPJ_INT32 OVar2;
  int iVar3;
  OPJ_INT32 OVar4;
  OPJ_INT32 OVar5;
  OPJ_INT16 *pOVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  uint uVar10;
  OPJ_UINT32 OVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  OPJ_UINT32 OVar20;
  opj_pi_resolution_t *poVar21;
  opj_pi_comp_t *poVar22;
  uint uVar23;
  bool bVar24;
  
  switch((pi->poc).prg) {
  case OPJ_LRCP:
    if (pi->first == 0) {
      uVar10 = pi->precno;
      goto LAB_00123c74;
    }
    pi->first = 0;
    uVar10 = (pi->poc).layno0;
    do {
      pi->layno = uVar10;
      if ((pi->poc).layno1 <= uVar10) {
        return 0;
      }
      uVar10 = (pi->poc).resno0;
      while (pi->resno = uVar10, uVar10 < (pi->poc).resno1) {
        for (uVar10 = (pi->poc).compno0; pi->compno = uVar10, uVar10 < (pi->poc).compno1;
            uVar10 = uVar10 + 1) {
          uVar13 = pi->resno;
          if (uVar13 < pi->comps[uVar10].numresolutions) {
            if (pi->tp_on == '\0') {
              poVar21 = pi->comps[uVar10].resolutions;
              (pi->poc).precno1 = poVar21[uVar13].ph * poVar21[uVar13].pw;
            }
            for (uVar10 = (pi->poc).precno0; pi->precno = uVar10, uVar10 < (pi->poc).precno1;
                uVar10 = uVar10 + 1) {
              uVar13 = pi->step_p * uVar10 +
                       pi->step_c * pi->compno + pi->step_r * pi->resno + pi->step_l * pi->layno;
              if (pi->include_size <= uVar13) {
                return 0;
              }
              pOVar6 = pi->include;
              uVar14 = (ulong)uVar13;
              if (pOVar6[uVar14] == 0) goto LAB_00123d32;
LAB_00123c74:
            }
            uVar10 = pi->compno;
          }
        }
        uVar10 = pi->resno + 1;
      }
      uVar10 = pi->layno + 1;
    } while( true );
  case OPJ_RLCP:
    if (pi->first == 0) {
      uVar10 = pi->precno;
      goto LAB_00123df8;
    }
    pi->first = 0;
    uVar10 = (pi->poc).resno0;
    do {
      pi->resno = uVar10;
      if ((pi->poc).resno1 <= uVar10) {
        return 0;
      }
      uVar10 = (pi->poc).layno0;
      while (pi->layno = uVar10, uVar10 < (pi->poc).layno1) {
        for (uVar10 = (pi->poc).compno0; pi->compno = uVar10, uVar10 < (pi->poc).compno1;
            uVar10 = uVar10 + 1) {
          uVar13 = pi->resno;
          if (uVar13 < pi->comps[uVar10].numresolutions) {
            if (pi->tp_on == '\0') {
              poVar21 = pi->comps[uVar10].resolutions;
              (pi->poc).precno1 = poVar21[uVar13].ph * poVar21[uVar13].pw;
            }
            for (uVar10 = (pi->poc).precno0; pi->precno = uVar10, uVar10 < (pi->poc).precno1;
                uVar10 = uVar10 + 1) {
              uVar13 = pi->step_p * uVar10 +
                       pi->step_c * pi->compno + pi->step_r * pi->resno + pi->step_l * pi->layno;
              if (pi->include_size <= uVar13) {
                return 0;
              }
              pOVar6 = pi->include;
              uVar14 = (ulong)uVar13;
              if (pOVar6[uVar14] == 0) goto LAB_00123d32;
LAB_00123df8:
            }
            uVar10 = pi->compno;
          }
        }
        uVar10 = pi->layno + 1;
      }
      uVar10 = pi->resno + 1;
    } while( true );
  case OPJ_RPCL:
    if (pi->first == 0) {
      uVar10 = pi->layno;
      goto LAB_00123e06;
    }
    pi->first = 0;
    pi->dx = 0;
    pi->dy = 0;
    if ((ulong)pi->numcomps != 0) {
      uVar10 = 0;
      OVar20 = 0;
      uVar14 = 0;
      do {
        uVar13 = pi->comps[uVar14].numresolutions;
        uVar18 = (ulong)uVar13;
        if (uVar18 != 0) {
          poVar22 = pi->comps + uVar14;
          poVar21 = poVar22->resolutions;
          lVar15 = 0;
          do {
            uVar13 = uVar13 - 1;
            uVar19 = *(int *)((long)&poVar21->pdx + lVar15) + uVar13;
            if (uVar19 < 0x20) {
              bVar7 = (byte)uVar19;
              if (poVar22->dx <= 0xffffffffU >> (bVar7 & 0x1f)) {
                uVar19 = poVar22->dx << (bVar7 & 0x1f);
                OVar11 = uVar19;
                if (OVar20 < uVar19) {
                  OVar11 = OVar20;
                }
                bVar24 = OVar20 == 0;
                OVar20 = OVar11;
                if (bVar24) {
                  OVar20 = uVar19;
                }
                pi->dx = OVar20;
              }
            }
            uVar19 = *(int *)((long)&poVar21->pdy + lVar15) + uVar13;
            if (uVar19 < 0x20) {
              bVar7 = (byte)uVar19;
              if (poVar22->dy <= 0xffffffffU >> (bVar7 & 0x1f)) {
                uVar23 = poVar22->dy << (bVar7 & 0x1f);
                uVar19 = uVar23;
                if (uVar10 < uVar23) {
                  uVar19 = uVar10;
                }
                bVar24 = uVar10 == 0;
                uVar10 = uVar19;
                if (bVar24) {
                  uVar10 = uVar23;
                }
                pi->dy = uVar10;
              }
            }
            lVar15 = lVar15 + 0x10;
          } while (uVar18 << 4 != lVar15);
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 != pi->numcomps);
      if (OVar20 == 0) {
        return 0;
      }
      if (uVar10 == 0) {
        return 0;
      }
      if (pi->tp_on == '\0') {
        OVar4 = pi->ty0;
        OVar5 = pi->tx1;
        OVar2 = pi->ty1;
        (pi->poc).tx0 = pi->tx0;
        (pi->poc).tx1 = OVar5;
        (pi->poc).ty0 = OVar4;
        (pi->poc).ty1 = OVar2;
      }
      uVar10 = (pi->poc).resno0;
      while (pi->resno = uVar10, uVar10 < (pi->poc).resno1) {
        iVar12 = (pi->poc).ty0;
        while (pi->y = iVar12, iVar12 < (pi->poc).ty1) {
          iVar12 = (pi->poc).tx0;
          while (pi->x = iVar12, iVar12 < (pi->poc).tx1) {
            for (OVar20 = (pi->poc).compno0; pi->compno = OVar20, OVar20 < (pi->poc).compno1;
                OVar20 = OVar20 + 1) {
              uVar10 = pi->resno;
              uVar13 = pi->comps[OVar20].numresolutions;
              if ((uVar10 < uVar13) && (uVar13 = uVar13 + ~uVar10, uVar13 < 0x20)) {
                poVar22 = pi->comps + OVar20;
                uVar19 = poVar22->dx;
                bVar7 = (byte)uVar13;
                uVar23 = uVar19 << (bVar7 & 0x1f);
                if (uVar23 >> (bVar7 & 0x1f) == uVar19) {
                  uVar17 = poVar22->dy;
                  uVar16 = uVar17 << (bVar7 & 0x1f);
                  if ((uVar16 >> (bVar7 & 0x1f) == uVar17) && (-1 < (int)(uVar16 | uVar23))) {
                    if (uVar19 << (bVar7 & 0x1f) == 0) {
LAB_00124783:
                      __assert_fail("b",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/opj_intmath.h"
                                    ,0xa2,"OPJ_INT32 opj_int_ceildiv(OPJ_INT32, OPJ_INT32)");
                    }
                    uVar14 = (ulong)uVar23;
                    if (uVar17 << (bVar7 & 0x1f) == 0) goto LAB_00124783;
                    poVar21 = poVar22->resolutions + uVar10;
                    uVar18 = (ulong)uVar16;
                    uVar10 = poVar21->pdx + uVar13;
                    if (((uVar10 < 0x1f) &&
                        (bVar8 = (byte)uVar10, uVar19 <= 0xffffffffU >> (bVar8 & 0x1f))) &&
                       (uVar13 = poVar21->pdy + uVar13, uVar13 < 0x1f)) {
                      bVar9 = (byte)uVar13;
                      uVar10 = uVar17 << (bVar9 & 0x1f);
                      if (uVar10 >> (bVar9 & 0x1f) == uVar17) {
                        iVar12 = (int)((long)(uVar18 + (long)pi->ty0 + -1) / (long)uVar18);
                        if ((pi->y % (int)uVar10 == 0) ||
                           ((pi->y == pi->ty0 &&
                            ((iVar12 << (bVar7 & 0x1f) & ~(-1 << (bVar9 & 0x1f))) != 0)))) {
                          iVar1 = pi->x;
                          iVar3 = (int)((long)((long)pi->tx0 + uVar14 + -1) / (long)uVar14);
                          if (((iVar1 % (int)(uVar19 << (bVar8 & 0x1f)) == 0) ||
                              ((iVar1 == pi->tx0 &&
                               ((iVar3 << (bVar7 & 0x1f) & ~(-1 << (bVar8 & 0x1f))) != 0)))) &&
                             ((poVar21->pw != 0 &&
                              (((poVar21->ph != 0 &&
                                (iVar3 != (int)((long)((long)pi->tx1 + (uVar14 - 1)) / (long)uVar14)
                                )) && (iVar12 != (int)((long)((long)pi->ty1 + uVar18 + -1) /
                                                      (long)uVar18))))))) {
                            OVar4 = opj_int_ceildiv(iVar1,uVar23);
                            bVar8 = (byte)poVar21->pdx;
                            OVar5 = opj_int_ceildiv(pi->y,poVar22->dy << (bVar7 & 0x1f));
                            bVar7 = (byte)poVar21->pdy;
                            pi->precno = ((OVar5 >> (bVar7 & 0x1f)) - (iVar12 >> (bVar7 & 0x1f))) *
                                         poVar21->pw +
                                         ((OVar4 >> (bVar8 & 0x1f)) - (iVar3 >> (bVar8 & 0x1f)));
                            for (uVar10 = (pi->poc).layno0; pi->layno = uVar10,
                                uVar10 < (pi->poc).layno1; uVar10 = uVar10 + 1) {
                              uVar13 = pi->step_p * pi->precno +
                                       pi->step_c * pi->compno + pi->step_r * pi->resno +
                                       pi->step_l * uVar10;
                              if (pi->include_size <= uVar13) {
                                return 0;
                              }
                              pOVar6 = pi->include;
                              uVar14 = (ulong)uVar13;
                              if (pOVar6[uVar14] == 0) goto LAB_001240f6;
LAB_00123e06:
                            }
                            OVar20 = pi->compno;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
            iVar12 = (pi->x + pi->dx) - pi->x % (int)pi->dx;
          }
          iVar12 = (pi->y + pi->dy) - pi->y % (int)pi->dy;
        }
        uVar10 = pi->resno + 1;
      }
    }
    break;
  case OPJ_PCRL:
    if (pi->first == 0) {
      uVar10 = pi->layno;
      poVar22 = pi->comps + pi->compno;
      goto LAB_001243ea;
    }
    pi->first = 0;
    pi->dx = 0;
    pi->dy = 0;
    if ((ulong)pi->numcomps != 0) {
      uVar10 = 0;
      OVar20 = 0;
      uVar14 = 0;
      do {
        uVar13 = pi->comps[uVar14].numresolutions;
        uVar18 = (ulong)uVar13;
        if (uVar18 != 0) {
          poVar22 = pi->comps + uVar14;
          poVar21 = poVar22->resolutions;
          lVar15 = 0;
          do {
            uVar13 = uVar13 - 1;
            uVar19 = *(int *)((long)&poVar21->pdx + lVar15) + uVar13;
            if (uVar19 < 0x20) {
              bVar7 = (byte)uVar19;
              if (poVar22->dx <= 0xffffffffU >> (bVar7 & 0x1f)) {
                uVar19 = poVar22->dx << (bVar7 & 0x1f);
                OVar11 = uVar19;
                if (OVar20 < uVar19) {
                  OVar11 = OVar20;
                }
                bVar24 = OVar20 == 0;
                OVar20 = OVar11;
                if (bVar24) {
                  OVar20 = uVar19;
                }
                pi->dx = OVar20;
              }
            }
            uVar19 = *(int *)((long)&poVar21->pdy + lVar15) + uVar13;
            if (uVar19 < 0x20) {
              bVar7 = (byte)uVar19;
              if (poVar22->dy <= 0xffffffffU >> (bVar7 & 0x1f)) {
                uVar23 = poVar22->dy << (bVar7 & 0x1f);
                uVar19 = uVar23;
                if (uVar10 < uVar23) {
                  uVar19 = uVar10;
                }
                bVar24 = uVar10 == 0;
                uVar10 = uVar19;
                if (bVar24) {
                  uVar10 = uVar23;
                }
                pi->dy = uVar10;
              }
            }
            lVar15 = lVar15 + 0x10;
          } while (uVar18 << 4 != lVar15);
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 != pi->numcomps);
      if (OVar20 == 0) {
        return 0;
      }
      if (uVar10 == 0) {
        return 0;
      }
      if (pi->tp_on == '\0') {
        OVar4 = pi->ty0;
        OVar5 = pi->tx1;
        OVar2 = pi->ty1;
        (pi->poc).tx0 = pi->tx0;
        (pi->poc).tx1 = OVar5;
        (pi->poc).ty0 = OVar4;
        (pi->poc).ty1 = OVar2;
        iVar12 = pi->ty0;
      }
      else {
        iVar12 = (pi->poc).ty0;
      }
      while (pi->y = iVar12, iVar12 < (pi->poc).ty1) {
        iVar12 = (pi->poc).tx0;
        while (pi->x = iVar12, iVar12 < (pi->poc).tx1) {
          uVar10 = (pi->poc).compno0;
          while (pi->compno = uVar10, uVar10 < (pi->poc).compno1) {
            poVar22 = pi->comps + uVar10;
            OVar20 = (pi->poc).resno0;
            while( true ) {
              pi->resno = OVar20;
              uVar10 = (pi->poc).resno1;
              uVar13 = poVar22->numresolutions;
              if (uVar13 <= uVar10) {
                uVar10 = uVar13;
              }
              if (uVar10 <= OVar20) break;
              uVar13 = uVar13 + ~OVar20;
              if (uVar13 < 0x20) {
                uVar10 = poVar22->dx;
                bVar7 = (byte)uVar13;
                uVar19 = uVar10 << (bVar7 & 0x1f);
                if (uVar19 >> (bVar7 & 0x1f) == uVar10) {
                  uVar23 = poVar22->dy;
                  uVar17 = uVar23 << (bVar7 & 0x1f);
                  if ((uVar17 >> (bVar7 & 0x1f) == uVar23) && (-1 < (int)(uVar17 | uVar19))) {
                    if (uVar10 << (bVar7 & 0x1f) == 0) goto LAB_00124783;
                    uVar14 = (ulong)uVar19;
                    if (uVar23 << (bVar7 & 0x1f) == 0) goto LAB_00124783;
                    poVar21 = poVar22->resolutions + OVar20;
                    uVar18 = (ulong)uVar17;
                    uVar17 = poVar21->pdx + uVar13;
                    if (((uVar17 < 0x1f) &&
                        (bVar8 = (byte)uVar17, uVar10 <= 0xffffffffU >> (bVar8 & 0x1f))) &&
                       (uVar13 = poVar21->pdy + uVar13, uVar13 < 0x1f)) {
                      bVar9 = (byte)uVar13;
                      uVar13 = uVar23 << (bVar9 & 0x1f);
                      if (uVar13 >> (bVar9 & 0x1f) == uVar23) {
                        iVar12 = (int)((long)(uVar18 + (long)pi->ty0 + -1) / (long)uVar18);
                        if ((pi->y % (int)uVar13 == 0) ||
                           ((pi->y == pi->ty0 &&
                            ((iVar12 << (bVar7 & 0x1f) & ~(-1 << (bVar9 & 0x1f))) != 0)))) {
                          iVar1 = pi->x;
                          iVar3 = (int)((long)((long)pi->tx0 + uVar14 + -1) / (long)uVar14);
                          if (((iVar1 % (int)(uVar10 << (bVar8 & 0x1f)) == 0) ||
                              ((iVar1 == pi->tx0 &&
                               ((iVar3 << (bVar7 & 0x1f) & ~(-1 << (bVar8 & 0x1f))) != 0)))) &&
                             ((poVar21->pw != 0 &&
                              (((poVar21->ph != 0 &&
                                (iVar3 != (int)((long)((long)pi->tx1 + (uVar14 - 1)) / (long)uVar14)
                                )) && (iVar12 != (int)((long)((long)pi->ty1 + uVar18 + -1) /
                                                      (long)uVar18))))))) {
                            OVar4 = opj_int_ceildiv(iVar1,uVar19);
                            bVar8 = (byte)poVar21->pdx;
                            OVar5 = opj_int_ceildiv(pi->y,poVar22->dy << (bVar7 & 0x1f));
                            bVar7 = (byte)poVar21->pdy;
                            pi->precno = ((OVar5 >> (bVar7 & 0x1f)) - (iVar12 >> (bVar7 & 0x1f))) *
                                         poVar21->pw +
                                         ((OVar4 >> (bVar8 & 0x1f)) - (iVar3 >> (bVar8 & 0x1f)));
                            for (uVar10 = (pi->poc).layno0; pi->layno = uVar10,
                                uVar10 < (pi->poc).layno1; uVar10 = uVar10 + 1) {
                              uVar13 = pi->step_p * pi->precno +
                                       pi->step_c * pi->compno + pi->step_r * pi->resno +
                                       pi->step_l * uVar10;
                              if (pi->include_size <= uVar13) {
                                return 0;
                              }
                              pOVar6 = pi->include;
                              uVar14 = (ulong)uVar13;
                              if (pOVar6[uVar14] == 0) goto LAB_001240f6;
LAB_001243ea:
                            }
                            OVar20 = pi->resno;
                          }
                        }
                      }
                    }
                  }
                }
              }
              OVar20 = OVar20 + 1;
            }
            uVar10 = pi->compno + 1;
          }
          iVar12 = (pi->x + pi->dx) - pi->x % (int)pi->dx;
        }
        iVar12 = (pi->y + pi->dy) - pi->y % (int)pi->dy;
      }
    }
    break;
  case OPJ_CPRL:
    if (pi->first == 0) {
      uVar10 = pi->layno;
      poVar22 = pi->comps + pi->compno;
      goto LAB_001247e5;
    }
    pi->first = 0;
    uVar10 = (pi->poc).compno0;
    while (pi->compno = uVar10, uVar10 < (pi->poc).compno1) {
      pi->dx = 0;
      pi->dy = 0;
      uVar13 = pi->comps[uVar10].numresolutions;
      uVar14 = (ulong)uVar13;
      if (uVar14 == 0) {
        return 0;
      }
      poVar22 = pi->comps + uVar10;
      poVar21 = poVar22->resolutions;
      lVar15 = 0;
      OVar11 = 0;
      OVar20 = 0;
      do {
        uVar13 = uVar13 - 1;
        uVar10 = *(int *)((long)&poVar21->pdx + lVar15) + uVar13;
        if (uVar10 < 0x20) {
          bVar7 = (byte)uVar10;
          if (poVar22->dx <= 0xffffffffU >> (bVar7 & 0x1f)) {
            uVar19 = poVar22->dx << (bVar7 & 0x1f);
            uVar10 = uVar19;
            if (OVar20 < uVar19) {
              uVar10 = OVar20;
            }
            bVar24 = OVar20 == 0;
            OVar20 = uVar10;
            if (bVar24) {
              OVar20 = uVar19;
            }
            pi->dx = OVar20;
          }
        }
        uVar10 = *(int *)((long)&poVar21->pdy + lVar15) + uVar13;
        if (uVar10 < 0x20) {
          bVar7 = (byte)uVar10;
          if (poVar22->dy <= 0xffffffffU >> (bVar7 & 0x1f)) {
            uVar19 = poVar22->dy << (bVar7 & 0x1f);
            uVar10 = uVar19;
            if (OVar11 < uVar19) {
              uVar10 = OVar11;
            }
            bVar24 = OVar11 == 0;
            OVar11 = uVar10;
            if (bVar24) {
              OVar11 = uVar19;
            }
            pi->dy = OVar11;
          }
        }
        lVar15 = lVar15 + 0x10;
      } while (uVar14 << 4 != lVar15);
      if (OVar20 == 0) {
        return 0;
      }
      if (OVar11 == 0) {
        return 0;
      }
      if (pi->tp_on == '\0') {
        OVar4 = pi->ty0;
        OVar5 = pi->tx1;
        OVar2 = pi->ty1;
        (pi->poc).tx0 = pi->tx0;
        (pi->poc).tx1 = OVar5;
        (pi->poc).ty0 = OVar4;
        (pi->poc).ty1 = OVar2;
        iVar12 = pi->ty0;
      }
      else {
        iVar12 = (pi->poc).ty0;
      }
      while (pi->y = iVar12, iVar12 < (pi->poc).ty1) {
        iVar12 = (pi->poc).tx0;
        while (pi->x = iVar12, iVar12 < (pi->poc).tx1) {
          OVar20 = (pi->poc).resno0;
          while( true ) {
            pi->resno = OVar20;
            uVar10 = (pi->poc).resno1;
            uVar13 = poVar22->numresolutions;
            if (uVar13 <= uVar10) {
              uVar10 = uVar13;
            }
            if (uVar10 <= OVar20) break;
            uVar13 = uVar13 + ~OVar20;
            if (uVar13 < 0x20) {
              uVar10 = poVar22->dx;
              bVar7 = (byte)uVar13;
              uVar19 = uVar10 << (bVar7 & 0x1f);
              if (uVar19 >> (bVar7 & 0x1f) == uVar10) {
                uVar23 = poVar22->dy;
                uVar17 = uVar23 << (bVar7 & 0x1f);
                if ((uVar17 >> (bVar7 & 0x1f) == uVar23) && (-1 < (int)(uVar17 | uVar19))) {
                  if (uVar10 << (bVar7 & 0x1f) == 0) goto LAB_00124783;
                  uVar14 = (ulong)uVar19;
                  if (uVar17 == 0) goto LAB_00124783;
                  poVar21 = poVar22->resolutions + OVar20;
                  uVar18 = (ulong)uVar17;
                  uVar17 = poVar21->pdx + uVar13;
                  if (((uVar17 < 0x1f) &&
                      (bVar8 = (byte)uVar17, uVar10 <= 0xffffffffU >> (bVar8 & 0x1f))) &&
                     (uVar13 = poVar21->pdy + uVar13, uVar13 < 0x1f)) {
                    bVar9 = (byte)uVar13;
                    uVar13 = uVar23 << (bVar9 & 0x1f);
                    if (uVar13 >> (bVar9 & 0x1f) == uVar23) {
                      iVar12 = (int)((long)(uVar18 + (long)pi->ty0 + -1) / (long)uVar18);
                      if ((pi->y % (int)uVar13 == 0) ||
                         ((pi->y == pi->ty0 &&
                          ((iVar12 << (bVar7 & 0x1f) & ~(-1 << (bVar9 & 0x1f))) != 0)))) {
                        iVar1 = pi->x;
                        iVar3 = (int)((long)((long)pi->tx0 + uVar14 + -1) / (long)uVar14);
                        if (((iVar1 % (int)(uVar10 << (bVar8 & 0x1f)) == 0) ||
                            ((iVar1 == pi->tx0 &&
                             ((iVar3 << (bVar7 & 0x1f) & ~(-1 << (bVar8 & 0x1f))) != 0)))) &&
                           ((poVar21->pw != 0 &&
                            (((poVar21->ph != 0 &&
                              (iVar3 != (int)((long)((long)pi->tx1 + (uVar14 - 1)) / (long)uVar14)))
                             && (iVar12 != (int)((long)((long)pi->ty1 + uVar18 + -1) / (long)uVar18)
                                )))))) {
                          OVar4 = opj_int_ceildiv(iVar1,uVar19);
                          bVar8 = (byte)poVar21->pdx;
                          OVar5 = opj_int_ceildiv(pi->y,poVar22->dy << (bVar7 & 0x1f));
                          bVar7 = (byte)poVar21->pdy;
                          pi->precno = ((OVar5 >> (bVar7 & 0x1f)) - (iVar12 >> (bVar7 & 0x1f))) *
                                       poVar21->pw +
                                       ((OVar4 >> (bVar8 & 0x1f)) - (iVar3 >> (bVar8 & 0x1f)));
                          for (uVar10 = (pi->poc).layno0; pi->layno = uVar10,
                              uVar10 < (pi->poc).layno1; uVar10 = uVar10 + 1) {
                            uVar13 = pi->step_p * pi->precno +
                                     pi->step_c * pi->compno + pi->step_r * pi->resno +
                                     pi->step_l * uVar10;
                            if (pi->include_size <= uVar13) {
                              return 0;
                            }
                            pOVar6 = pi->include;
                            uVar14 = (ulong)uVar13;
                            if (pOVar6[uVar14] == 0) goto LAB_001240f6;
LAB_001247e5:
                          }
                          OVar20 = pi->resno;
                        }
                      }
                    }
                  }
                }
              }
            }
            OVar20 = OVar20 + 1;
          }
          iVar12 = (pi->x + pi->dx) - pi->x % (int)pi->dx;
        }
        iVar12 = (pi->y + pi->dy) - pi->y % (int)pi->dy;
      }
      uVar10 = pi->compno + 1;
    }
  }
  return 0;
LAB_001240f6:
  pOVar6 = pOVar6 + uVar14;
  goto LAB_00123d36;
LAB_00123d32:
  pOVar6 = pOVar6 + uVar14;
LAB_00123d36:
  *pOVar6 = 1;
  return 1;
}

Assistant:

OPJ_BOOL opj_pi_next(opj_pi_iterator_t * pi)
{
    switch (pi->poc.prg) {
    case OPJ_LRCP:
        return opj_pi_next_lrcp(pi);
    case OPJ_RLCP:
        return opj_pi_next_rlcp(pi);
    case OPJ_RPCL:
        return opj_pi_next_rpcl(pi);
    case OPJ_PCRL:
        return opj_pi_next_pcrl(pi);
    case OPJ_CPRL:
        return opj_pi_next_cprl(pi);
    case OPJ_PROG_UNKNOWN:
        return OPJ_FALSE;
    }

    return OPJ_FALSE;
}